

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O0

bool Fossilize::get_safe_member_string(Value *value,char *member,string *out_value)

{
  bool bVar1;
  SizeType SVar2;
  Ch *__beg;
  allocator<char> local_59;
  string local_58 [32];
  Ch *local_38;
  char *str;
  Value *memb;
  string *out_value_local;
  char *member_local;
  Value *value_local;
  
  memb = (Value *)out_value;
  out_value_local = (string *)member;
  member_local = (char *)value;
  str = (char *)get_safe_member(value,member);
  if (((Value *)str == (Value *)0x0) ||
     (bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)str), !bVar1)) {
    fprintf(_stderr,"Fossilize ERROR: Not a string.\n");
    value_local._7_1_ = false;
  }
  else {
    __beg = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)str);
    local_38 = __beg;
    SVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetStringLength((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)str);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(local_58,__beg,__beg + SVar2,&local_59);
    std::__cxx11::string::operator=((string *)memb,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
    value_local._7_1_ = true;
  }
  return value_local._7_1_;
}

Assistant:

static bool get_safe_member_string(const Value &value, const char *member, std::string &out_value)
{
	auto *memb = get_safe_member(value, member);
	if (memb && memb->IsString())
	{
		const char *str = memb->GetString();
		out_value = std::string(str, str + memb->GetStringLength());
		return true;
	}
	else
	{
		LOGE("Not a string.\n");
		return false;
	}
}